

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decahedron.cpp
# Opt level: O3

vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> * __thiscall
OpenMD::Decahedron::truncatedRing
          (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
           *__return_storage_ptr__,Decahedron *this,int n,int k)

{
  pointer pVVar1;
  uint i;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  double local_118 [4];
  double local_f8 [4];
  double local_d8 [4];
  double local_b8 [4];
  double local_98 [4];
  ulong local_78;
  Decahedron *local_70;
  Vector3<double> local_68;
  double local_48 [3];
  
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar7 = (double)n;
  local_78 = (ulong)(uint)(n - k);
  uVar5 = 0;
  local_118[3] = dVar7;
  local_70 = this;
  do {
    uVar6 = uVar5 + 1;
    uVar3 = 0;
    if (uVar6 != 5) {
      uVar3 = uVar6 & 0xffffffff;
    }
    pVVar1 = (local_70->Basis).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_98[2] = pVVar1[uVar5].super_Vector<double,_3U>.data_[2];
    local_98[0] = pVVar1[uVar5].super_Vector<double,_3U>.data_[0];
    local_98[1] = pVVar1[uVar5].super_Vector<double,_3U>.data_[1];
    local_48[2] = pVVar1[uVar3].super_Vector<double,_3U>.data_[2];
    local_48[0] = pVVar1[uVar3].super_Vector<double,_3U>.data_[0];
    local_48[1] = pVVar1[uVar3].super_Vector<double,_3U>.data_[1];
    if (k == 0) {
      if (0 < n) {
        iVar4 = 0;
        do {
          local_b8[0] = 0.0;
          local_b8[1] = 0.0;
          local_b8[2] = 0.0;
          lVar2 = 0;
          do {
            local_b8[lVar2] = local_98[lVar2] * dVar7;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 3);
          local_f8[0] = 0.0;
          local_f8[1] = 0.0;
          local_f8[2] = 0.0;
          lVar2 = 0;
          do {
            local_f8[lVar2] = local_48[lVar2] - local_98[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 3);
          local_d8[0] = 0.0;
          local_d8[1] = 0.0;
          local_d8[2] = 0.0;
          lVar2 = 0;
          do {
            local_d8[lVar2] = local_f8[lVar2] * (double)iVar4;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 3);
          local_118[0] = 0.0;
          local_118[1] = 0.0;
          local_118[2] = 0.0;
          lVar2 = 0;
          do {
            local_118[lVar2] = local_b8[lVar2] + local_d8[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 3);
          local_68.super_Vector<double,_3U>.data_[2] = local_118[2];
          local_68.super_Vector<double,_3U>.data_[0] = local_118[0];
          local_68.super_Vector<double,_3U>.data_[1] = local_118[1];
          std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
          emplace_back<OpenMD::Vector3<double>>
                    ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                     __return_storage_ptr__,&local_68);
          iVar4 = iVar4 + 1;
          dVar7 = local_118[3];
        } while (iVar4 != n);
      }
    }
    else {
      iVar4 = k;
      if (k <= (int)local_78) {
        do {
          local_b8[0] = 0.0;
          local_b8[1] = 0.0;
          local_b8[2] = 0.0;
          lVar2 = 0;
          do {
            local_b8[lVar2] = local_98[lVar2] * dVar7;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 3);
          local_f8[0] = 0.0;
          local_f8[1] = 0.0;
          local_f8[2] = 0.0;
          lVar2 = 0;
          do {
            local_f8[lVar2] = local_48[lVar2] - local_98[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 3);
          local_d8[0] = 0.0;
          local_d8[1] = 0.0;
          local_d8[2] = 0.0;
          lVar2 = 0;
          do {
            local_d8[lVar2] = local_f8[lVar2] * (double)iVar4;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 3);
          local_118[0] = 0.0;
          local_118[1] = 0.0;
          local_118[2] = 0.0;
          lVar2 = 0;
          do {
            local_118[lVar2] = local_b8[lVar2] + local_d8[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 3);
          local_68.super_Vector<double,_3U>.data_[2] = local_118[2];
          local_68.super_Vector<double,_3U>.data_[0] = local_118[0];
          local_68.super_Vector<double,_3U>.data_[1] = local_118[1];
          std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
          emplace_back<OpenMD::Vector3<double>>
                    ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                     __return_storage_ptr__,&local_68);
          iVar4 = iVar4 + 1;
          dVar7 = local_118[3];
        } while (iVar4 != (n - k) + 1U);
      }
    }
    uVar5 = uVar6;
  } while (uVar6 != 5);
  return __return_storage_ptr__;
}

Assistant:

vector<Vector3d> Decahedron::truncatedRing(int n, int k) {
    // This function generates the rings of a Decahedron
    // n: index of shell (order of ring)
    // k: how many atoms are missing from both ends of one side of
    //    pentagon ring

    vector<Vector3d> ring;

    // Generate atomic coordinates along each side of pentagonal ring
    for (int i = 0; i < 5; i++) {
      Vector3d b1 = Basis[i];
      Vector3d b2 = Basis[(i + 1) % 5];

      if (k == 0) {
        // without truncation
        for (int j = 0; j < n; j++) {
          ring.push_back(RealType(n) * b1 + RealType(j) * (b2 - b1));
        }

      } else {
        for (int j = k; j <= n - k; j++) {
          // with truncation
          ring.push_back(RealType(n) * b1 + RealType(j) * (b2 - b1));
        }
      }
    }
    return ring;
  }